

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  char *in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  memory_buf_t *in_stack_fffffffffffffe78;
  memory_buf_t *formatted_00;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_fffffffffffffe80;
  ansicolor_sink<spdlog::details::console_mutex> *this_01;
  undefined1 local_160 [40];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_138;
  char *local_10;
  ansicolor_sink<spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe70,
             (mutex_type *)in_stack_fffffffffffffe68);
  local_10[0x28] = '\0';
  local_10[0x29] = '\0';
  local_10[0x2a] = '\0';
  local_10[0x2b] = '\0';
  local_10[0x2c] = '\0';
  local_10[0x2d] = '\0';
  local_10[0x2e] = '\0';
  local_10[0x2f] = '\0';
  local_10[0x30] = '\0';
  local_10[0x31] = '\0';
  local_10[0x32] = '\0';
  local_10[0x33] = '\0';
  local_10[0x34] = '\0';
  local_10[0x35] = '\0';
  local_10[0x36] = '\0';
  local_10[0x37] = '\0';
  std::allocator<char>::allocator();
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe70,(allocator<char> *)in_stack_fffffffffffffe68);
  std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x27));
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x2c37d3);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_138);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(local_10 + 0x30) <= *(ulong *)(local_10 + 0x28))) {
    this_00 = &local_138;
    fmt::v10::detail::buffer<char>::size(&this_00->super_buffer<char>);
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)this_00);
  }
  else {
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
    ::at((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
          *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    this_01 = (ansicolor_sink<spdlog::details::console_mutex> *)local_160;
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    print_ccode_(this_01,(string_view_t *)in_stack_fffffffffffffe78);
    print_range_(this_01,in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,
                 (size_t)in_stack_fffffffffffffe68);
    print_ccode_(this_01,(string_view_t *)in_stack_fffffffffffffe78);
    formatted_00 = *(memory_buf_t **)(local_10 + 0x30);
    in_stack_fffffffffffffe70 = &local_138;
    fmt::v10::detail::buffer<char>::size(&in_stack_fffffffffffffe70->super_buffer<char>);
    print_range_(this_01,formatted_00,(size_t)in_stack_fffffffffffffe70,
                 (size_t)in_stack_fffffffffffffe68);
  }
  fflush((FILE *)this->target_file_);
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffe70);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2c397c);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg) {
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start) {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_.at(static_cast<size_t>(msg.level)));
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    } else  // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}